

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O0

int LogL16InitState(TIFF *tif)

{
  uint8_t *puVar1;
  int iVar2;
  tmsize_t tVar3;
  void *pvVar4;
  LogLuvState *sp;
  TIFFDirectory *td;
  TIFF *tif_local;
  
  puVar1 = tif->tif_data;
  if (puVar1 == (uint8_t *)0x0) {
    __assert_fail("sp != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0x543,"int LogL16InitState(TIFF *)");
  }
  if ((tif->tif_dir).td_photometric == 0x804c) {
    if ((tif->tif_dir).td_samplesperpixel == 1) {
      if (*(int *)(puVar1 + 4) == -1) {
        iVar2 = LogL16GuessDataFmt(&tif->tif_dir);
        *(int *)(puVar1 + 4) = iVar2;
      }
      iVar2 = *(int *)(puVar1 + 4);
      if (iVar2 == 0) {
        puVar1[0xc] = '\x04';
        puVar1[0xd] = '\0';
        puVar1[0xe] = '\0';
        puVar1[0xf] = '\0';
      }
      else if (iVar2 == 1) {
        puVar1[0xc] = '\x02';
        puVar1[0xd] = '\0';
        puVar1[0xe] = '\0';
        puVar1[0xf] = '\0';
      }
      else {
        if (iVar2 != 3) {
          TIFFErrorExtR(tif,"LogL16InitState","No support for converting user data format to LogL");
          return 0;
        }
        puVar1[0xc] = '\x01';
        puVar1[0xd] = '\0';
        puVar1[0xe] = '\0';
        puVar1[0xf] = '\0';
      }
      if ((tif->tif_flags & 0x400) == 0) {
        if ((tif->tif_dir).td_rowsperstrip < (tif->tif_dir).td_imagelength) {
          tVar3 = multiply_ms((ulong)(tif->tif_dir).td_imagewidth,
                              (ulong)(tif->tif_dir).td_rowsperstrip);
          *(tmsize_t *)(puVar1 + 0x18) = tVar3;
        }
        else {
          tVar3 = multiply_ms((ulong)(tif->tif_dir).td_imagewidth,
                              (ulong)(tif->tif_dir).td_imagelength);
          *(tmsize_t *)(puVar1 + 0x18) = tVar3;
        }
      }
      else {
        tVar3 = multiply_ms((ulong)(tif->tif_dir).td_tilewidth,(ulong)(tif->tif_dir).td_tilelength);
        *(tmsize_t *)(puVar1 + 0x18) = tVar3;
      }
      tVar3 = multiply_ms(*(tmsize_t *)(puVar1 + 0x18),2);
      if (tVar3 != 0) {
        pvVar4 = _TIFFmallocExt(tif,*(long *)(puVar1 + 0x18) << 1);
        *(void **)(puVar1 + 0x10) = pvVar4;
        if (pvVar4 != (void *)0x0) {
          return 1;
        }
      }
      TIFFErrorExtR(tif,"LogL16InitState","No space for SGILog translation buffer");
    }
    else {
      TIFFErrorExtR(tif,"LogL16InitState","Sorry, can not handle LogL image with %s=%u",
                    "Samples/pixel",(ulong)(tif->tif_dir).td_samplesperpixel);
    }
    return 0;
  }
  __assert_fail("td->td_photometric == PHOTOMETRIC_LOGL",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                ,0x544,"int LogL16InitState(TIFF *)");
}

Assistant:

static int LogL16InitState(TIFF *tif)
{
    static const char module[] = "LogL16InitState";
    TIFFDirectory *td = &tif->tif_dir;
    LogLuvState *sp = DecoderState(tif);

    assert(sp != NULL);
    assert(td->td_photometric == PHOTOMETRIC_LOGL);

    if (td->td_samplesperpixel != 1)
    {
        TIFFErrorExtR(tif, module,
                      "Sorry, can not handle LogL image with %s=%" PRIu16,
                      "Samples/pixel", td->td_samplesperpixel);
        return 0;
    }

    /* for some reason, we can't do this in TIFFInitLogL16 */
    if (sp->user_datafmt == SGILOGDATAFMT_UNKNOWN)
        sp->user_datafmt = LogL16GuessDataFmt(td);
    switch (sp->user_datafmt)
    {
        case SGILOGDATAFMT_FLOAT:
            sp->pixel_size = sizeof(float);
            break;
        case SGILOGDATAFMT_16BIT:
            sp->pixel_size = sizeof(int16_t);
            break;
        case SGILOGDATAFMT_8BIT:
            sp->pixel_size = sizeof(uint8_t);
            break;
        default:
            TIFFErrorExtR(tif, module,
                          "No support for converting user data format to LogL");
            return (0);
    }
    if (isTiled(tif))
        sp->tbuflen = multiply_ms(td->td_tilewidth, td->td_tilelength);
    else if (td->td_rowsperstrip < td->td_imagelength)
        sp->tbuflen = multiply_ms(td->td_imagewidth, td->td_rowsperstrip);
    else
        sp->tbuflen = multiply_ms(td->td_imagewidth, td->td_imagelength);
    if (multiply_ms(sp->tbuflen, sizeof(int16_t)) == 0 ||
        (sp->tbuf = (uint8_t *)_TIFFmallocExt(
             tif, sp->tbuflen * sizeof(int16_t))) == NULL)
    {
        TIFFErrorExtR(tif, module, "No space for SGILog translation buffer");
        return (0);
    }
    return (1);
}